

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ostream * operator<<(ostream *out,ShapeRange *shape)

{
  ostream *poVar1;
  RangeValue RVar2;
  RangeValue local_38;
  RangeValue local_28;
  ShapeRange *local_18;
  ShapeRange *shape_local;
  ostream *out_local;
  
  local_18 = shape;
  shape_local = (ShapeRange *)out;
  poVar1 = std::operator<<(out,"[");
  RVar2 = CoreML::ShapeRange::minimum(local_18);
  local_28._val = RVar2._val;
  local_28._isUnbound = RVar2._isUnbound;
  poVar1 = operator<<(poVar1,&local_28);
  poVar1 = std::operator<<(poVar1,", ");
  RVar2 = CoreML::ShapeRange::maximum(local_18);
  local_38._val = RVar2._val;
  local_38._isUnbound = RVar2._isUnbound;
  poVar1 = operator<<(poVar1,&local_38);
  std::operator<<(poVar1,"]");
  return (ostream *)shape_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ShapeRange& shape) {
    out << "[" << shape.minimum() << ", " << shape.maximum() << "]";
    return out;
}